

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

string * utils::getTimestamp_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  allocator<char> local_a9;
  char local_a8 [8];
  char buf [80];
  tm tstruct;
  time_t local_18;
  time_t now;
  
  local_18 = time((time_t *)0x0);
  buf[0x48] = '\0';
  buf[0x49] = '\0';
  buf[0x4a] = '\0';
  buf[0x4b] = '\0';
  buf[0x4c] = '\0';
  buf[0x4d] = '\0';
  buf[0x4e] = '\0';
  buf[0x4f] = '\0';
  ptVar1 = localtime(&local_18);
  buf._72_8_ = *(undefined8 *)ptVar1;
  strftime(local_a8,0x50,"%X",(tm *)(buf + 0x48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,local_a8,&local_a9);
  std::allocator<char>::~allocator(&local_a9);
  return in_RDI;
}

Assistant:

std::string utils::getTimestamp()
{
    time_t now = time(nullptr);
    struct tm tstruct = tm();
#ifdef WIN32
    localtime_s(&tstruct, &now);
#else
    tstruct = *localtime(&now);
#endif
    char buf[80];
    strftime(static_cast<char*>(buf), sizeof(buf), "%X", &tstruct);
    return std::string(static_cast<char*>(buf));
}